

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

bool __thiscall
tsbp::TwoStepBranchingProcedure::IsPlacementFeasible
          (TwoStepBranchingProcedure *this,PackingRelaxed2D *packing,Rectangle *itemToPlace)

{
  size_type pos;
  long lVar1;
  bool bVar2;
  reference pvVar3;
  reference this_00;
  Rectangle *pRVar4;
  reference pvVar5;
  reference pvVar6;
  int *piVar7;
  Rectangle *item;
  size_t i;
  int local_40;
  int minimumRemainingItemDyAtCurrentX;
  int minimumRemainingItemDy;
  int maximumRemainingItemDx;
  Rectangle *local_28;
  Rectangle *itemToPlace_local;
  PackingRelaxed2D *packing_local;
  TwoStepBranchingProcedure *this_local;
  
  if (((ulong)(long)(this->container).super_Rectangle.Dx < packing->MinX + (long)itemToPlace->Dx) ||
     (local_28 = itemToPlace, itemToPlace_local = (Rectangle *)packing,
     packing_local = (PackingRelaxed2D *)this,
     pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&packing->PlacedAreaVector,packing->MinX),
     (ulong)(long)(this->container).super_Rectangle.Dy < *pvVar3 + (long)local_28->Dy)) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = std::
              vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[](&this->itemSpecificPlacementPointsX,(long)local_28->InternId);
    pos._0_4_ = itemToPlace_local->X;
    pos._4_4_ = itemToPlace_local->Y;
    _minimumRemainingItemDy =
         boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                   (this_00,pos);
    bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool
                      ((reference *)&minimumRemainingItemDy);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      minimumRemainingItemDyAtCurrentX = 0;
      local_40 = (this->container).super_Rectangle.Dy;
      i._4_4_ = (this->container).super_Rectangle.Dy;
      for (item = (Rectangle *)0x0;
          pRVar4 = (Rectangle *)
                   std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size
                             (&this->items), item < pRVar4; item = (Rectangle *)((long)&item->X + 1)
          ) {
        pvVar5 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                           (&this->items,(size_type)item);
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &itemToPlace_local->Area,(long)pvVar5->InternId);
        if (bVar2) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&itemToPlace_local[2].Area,
                              (long)pvVar5->InternId);
          lVar1._0_4_ = itemToPlace_local->X;
          lVar1._4_4_ = itemToPlace_local->Y;
          if ((*pvVar6 == lVar1) && (local_28->InternId < pvVar5->InternId)) {
            return false;
          }
        }
        else {
          if (pvVar5->InternId != local_28->InternId) {
            piVar7 = std::min<int>(&local_40,&pvVar5->Dy);
            local_40 = *piVar7;
            piVar7 = std::max<int>(&minimumRemainingItemDyAtCurrentX,&pvVar5->Dx);
            minimumRemainingItemDyAtCurrentX = *piVar7;
          }
          if (local_28->InternId < pvVar5->InternId) {
            piVar7 = std::min<int>((int *)((long)&i + 4),&pvVar5->Dy);
            i._4_4_ = *piVar7;
          }
        }
      }
      itemToPlace_local->Dy = local_40;
      itemToPlace_local->Dx = i._4_4_;
      itemToPlace_local->InternId = minimumRemainingItemDyAtCurrentX;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TwoStepBranchingProcedure::IsPlacementFeasible(PackingRelaxed2D& packing, const Rectangle& itemToPlace)
{
    // No need to check feasibility in y-direction for x > packing.MinX, because, by construction, packing.PlacedAreaVector (K(x)) is non-increasing.
    if (packing.MinX + itemToPlace.Dx > this->container.Dx || packing.PlacedAreaVector[packing.MinX] + itemToPlace.Dy > this->container.Dy)
    {
        return false;
    }

    if (!this->itemSpecificPlacementPointsX[itemToPlace.InternId][packing.MinX])
    {
        return false;
    }

    int maximumRemainingItemDx = 0;
    int minimumRemainingItemDy = this->container.Dy;
    int minimumRemainingItemDyAtCurrentX = this->container.Dy;
    for (size_t i = 0; i < items.size(); i++)
    {
        const Rectangle& item = items[i];
        // Caution, requires i == items[i].InternId
        if (packing.PlacedItems.test(item.InternId))
        {
            if (packing.ItemCoordinatesX[item.InternId] == packing.MinX
                && itemToPlace.InternId < item.InternId)
            {
                return false;
            }
        }
        else
        {
            if (item.InternId != itemToPlace.InternId)
            {
                minimumRemainingItemDy = std::min<int>(minimumRemainingItemDy, item.Dy);
                maximumRemainingItemDx = std::max<int>(maximumRemainingItemDx, item.Dx);
            }

            if (itemToPlace.InternId < item.InternId)
            {
                minimumRemainingItemDyAtCurrentX = std::min<int>(minimumRemainingItemDyAtCurrentX, item.Dy);
            }
        }
    }

    ////packing.MinimumRemainingItemDy = 0;
    ////packing.MinimumRemainingItemDyAtCurrentX = 0;
    packing.MinimumRemainingItemDy = minimumRemainingItemDy;
    packing.MinimumRemainingItemDyAtCurrentX = minimumRemainingItemDyAtCurrentX;
    packing.MaximumRemainingItemDx = maximumRemainingItemDx;

    return true;
}